

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O2

IkSolutionBase<double> * __thiscall
ikfast::IkSolutionList<double>::GetSolution(IkSolutionList<double> *this,size_t index)

{
  runtime_error *this_00;
  const_iterator it;
  
  if (index < (this->_listsolutions).
              super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
              ._M_impl._M_node._M_size) {
    it._M_node = (this->_listsolutions).
                 super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
    std::__advance<std::_List_const_iterator<ikfast::IkSolution<double>>,long>(&it);
    return (IkSolutionBase<double> *)(it._M_node + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"GetSolution index is invalid");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual const IkSolutionBase<T>& GetSolution(size_t index) const
    {
        if( index >= _listsolutions.size() ) {
            throw std::runtime_error("GetSolution index is invalid");
        }
        typename std::list< IkSolution<T> >::const_iterator it = _listsolutions.begin();
        std::advance(it,index);
        return *it;
    }